

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

void yypop_buffer_state(void)

{
  YY_BUFFER_STATE pyVar1;
  YY_BUFFER_STATE *ppyVar2;
  size_t sVar3;
  
  if ((yy_buffer_stack != (YY_BUFFER_STATE *)0x0) &&
     (yy_buffer_stack[yy_buffer_stack_top] != (YY_BUFFER_STATE)0x0)) {
    yy_delete_buffer(yy_buffer_stack[yy_buffer_stack_top]);
    sVar3 = yy_buffer_stack_top;
    ppyVar2 = yy_buffer_stack;
    yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    if (sVar3 != 0) {
      yy_buffer_stack_top = sVar3 - 1;
      pyVar1 = ppyVar2[sVar3 - 1];
      if (pyVar1 != (YY_BUFFER_STATE)0x0) {
        yy_n_chars = pyVar1->yy_n_chars;
        yytext = pyVar1->yy_buf_pos;
        yyin = ppyVar2[sVar3 - 1]->yy_input_file;
        yy_hold_char = *yytext;
        yy_c_buf_p = yytext;
      }
    }
  }
  return;
}

Assistant:

void yypop_buffer_state (void)
{
    	if (!YY_CURRENT_BUFFER)
		return;

	yy_delete_buffer(YY_CURRENT_BUFFER );
	YY_CURRENT_BUFFER_LVALUE = NULL;
	if ((yy_buffer_stack_top) > 0)
		--(yy_buffer_stack_top);

	if (YY_CURRENT_BUFFER) {
		yy_load_buffer_state(  );
		(yy_did_buffer_switch_on_eof) = 1;
	}
}